

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dupprintf.c
# Opt level: O2

char * dupvprintf_inner(char *buf,size_t oldlen,size_t *sizeptr,char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  char *ptr;
  size_t oldlen_00;
  ulong extralen;
  size_t size;
  size_t *local_58;
  size_t local_50;
  va_list aq;
  
  size = *sizeptr;
  local_58 = sizeptr;
  ptr = (char *)safegrowarray(buf,&size,1,oldlen,0x200,true);
  local_50 = oldlen + 1;
  do {
    aq[0].reg_save_area = ap->reg_save_area;
    aq[0].gp_offset = ap->gp_offset;
    aq[0].fp_offset = ap->fp_offset;
    aq[0].overflow_arg_area = ap->overflow_arg_area;
    uVar1 = vsnprintf(ptr + oldlen,size - oldlen,fmt,aq);
    oldlen_00 = size;
    extralen = 1;
    if (-1 < (int)uVar1) {
      if (uVar1 < size) {
        *local_58 = size;
        return ptr;
      }
      if (uVar1 != 0) {
        oldlen_00 = local_50;
        extralen = (ulong)uVar1;
      }
    }
    ptr = (char *)safegrowarray(ptr,&size,1,oldlen_00,extralen,true);
  } while( true );
}

Assistant:

char *dupvprintf_inner(char *buf, size_t oldlen, size_t *sizeptr,
                       const char *fmt, va_list ap)
{
    size_t size = *sizeptr;
    sgrowarrayn_nm(buf, size, oldlen, 512);

    while (1) {
        va_list aq;
        va_copy(aq, ap);
        int len = vsnprintf(buf + oldlen, size - oldlen, fmt, aq);
        va_end(aq);

        if (len >= 0 && len < size) {
            /* This is the C99-specified criterion for snprintf to have
             * been completely successful. */
            *sizeptr = size;
            return buf;
        } else if (len > 0) {
            /* This is the C99 error condition: the returned length is
             * the required buffer size not counting the NUL. */
            sgrowarrayn_nm(buf, size, oldlen + 1, len);
        } else {
            /* This is the pre-C99 glibc error condition: <0 means the
             * buffer wasn't big enough, so we enlarge it a bit and hope. */
            sgrowarray_nm(buf, size, size);
        }
    }
}